

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O1

int64_t av1_lowbd_pixel_proj_error_c
                  (uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,int dat_stride,
                  int32_t *flt0,int flt0_stride,int32_t *flt1,int flt1_stride,int *xq,
                  sgr_params_type *params)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  
  if (0 < params->r[0]) {
    if (0 < params->r[1]) {
      iVar5 = 0;
      if (height < 1) {
        return 0;
      }
      lVar2 = 0;
      do {
        if (0 < width) {
          uVar4 = 0;
          do {
            bVar1 = dat8[uVar4];
            lVar3 = (long)((int)((flt0[uVar4] + (uint)bVar1 * -0x10) * *xq + (uint)bVar1 * 0x800 +
                                 (flt1[uVar4] + (uint)bVar1 * -0x10) * xq[1] + 0x400) >> 0xb) -
                    (ulong)src8[uVar4];
            lVar2 = lVar2 + lVar3 * lVar3;
            uVar4 = uVar4 + 1;
          } while ((uint)width != uVar4);
        }
        dat8 = dat8 + dat_stride;
        src8 = src8 + src_stride;
        iVar5 = iVar5 + 1;
        flt1 = flt1 + flt1_stride;
        flt0 = flt0 + flt0_stride;
      } while (iVar5 != height);
      return lVar2;
    }
    if (0 < params->r[0]) {
      iVar5 = 0;
      if (height < 1) {
        return 0;
      }
      lVar2 = 0;
      do {
        if (0 < width) {
          uVar4 = 0;
          do {
            lVar3 = (long)((int)((uint)dat8[uVar4] * 0x800 +
                                 (flt0[uVar4] + (uint)dat8[uVar4] * -0x10) * *xq + 0x400) >> 0xb) -
                    (ulong)src8[uVar4];
            lVar2 = lVar2 + lVar3 * lVar3;
            uVar4 = uVar4 + 1;
          } while ((uint)width != uVar4);
        }
        dat8 = dat8 + dat_stride;
        src8 = src8 + src_stride;
        iVar5 = iVar5 + 1;
        flt0 = flt0 + flt0_stride;
      } while (iVar5 != height);
      return lVar2;
    }
  }
  if (params->r[1] < 1) {
    iVar5 = 0;
    if (0 < height) {
      lVar2 = 0;
      do {
        if (0 < width) {
          uVar4 = 0;
          do {
            lVar2 = lVar2 + ((ulong)dat8[uVar4] - (ulong)src8[uVar4]) *
                            ((ulong)dat8[uVar4] - (ulong)src8[uVar4]);
            uVar4 = uVar4 + 1;
          } while ((uint)width != uVar4);
        }
        dat8 = dat8 + dat_stride;
        src8 = src8 + src_stride;
        iVar5 = iVar5 + 1;
      } while (iVar5 != height);
      return lVar2;
    }
  }
  else {
    iVar5 = 0;
    if (0 < height) {
      lVar2 = 0;
      do {
        if (0 < width) {
          uVar4 = 0;
          do {
            lVar3 = (long)((int)((uint)dat8[uVar4] * 0x800 +
                                 (flt1[uVar4] + (uint)dat8[uVar4] * -0x10) * xq[1] + 0x400) >> 0xb)
                    - (ulong)src8[uVar4];
            lVar2 = lVar2 + lVar3 * lVar3;
            uVar4 = uVar4 + 1;
          } while ((uint)width != uVar4);
        }
        dat8 = dat8 + dat_stride;
        src8 = src8 + src_stride;
        iVar5 = iVar5 + 1;
        flt1 = flt1 + flt1_stride;
      } while (iVar5 != height);
      return lVar2;
    }
  }
  return 0;
}

Assistant:

int64_t av1_lowbd_pixel_proj_error_c(const uint8_t *src8, int width, int height,
                                     int src_stride, const uint8_t *dat8,
                                     int dat_stride, int32_t *flt0,
                                     int flt0_stride, int32_t *flt1,
                                     int flt1_stride, int xq[2],
                                     const sgr_params_type *params) {
  int i, j;
  const uint8_t *src = src8;
  const uint8_t *dat = dat8;
  int64_t err = 0;
  if (params->r[0] > 0 && params->r[1] > 0) {
    for (i = 0; i < height; ++i) {
      for (j = 0; j < width; ++j) {
        assert(flt1[j] < (1 << 15) && flt1[j] > -(1 << 15));
        assert(flt0[j] < (1 << 15) && flt0[j] > -(1 << 15));
        const int32_t u = (int32_t)(dat[j] << SGRPROJ_RST_BITS);
        int32_t v = u << SGRPROJ_PRJ_BITS;
        v += xq[0] * (flt0[j] - u) + xq[1] * (flt1[j] - u);
        const int32_t e =
            ROUND_POWER_OF_TWO(v, SGRPROJ_RST_BITS + SGRPROJ_PRJ_BITS) - src[j];
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
      flt0 += flt0_stride;
      flt1 += flt1_stride;
    }
  } else if (params->r[0] > 0) {
    for (i = 0; i < height; ++i) {
      for (j = 0; j < width; ++j) {
        assert(flt0[j] < (1 << 15) && flt0[j] > -(1 << 15));
        const int32_t u = (int32_t)(dat[j] << SGRPROJ_RST_BITS);
        int32_t v = u << SGRPROJ_PRJ_BITS;
        v += xq[0] * (flt0[j] - u);
        const int32_t e =
            ROUND_POWER_OF_TWO(v, SGRPROJ_RST_BITS + SGRPROJ_PRJ_BITS) - src[j];
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
      flt0 += flt0_stride;
    }
  } else if (params->r[1] > 0) {
    for (i = 0; i < height; ++i) {
      for (j = 0; j < width; ++j) {
        assert(flt1[j] < (1 << 15) && flt1[j] > -(1 << 15));
        const int32_t u = (int32_t)(dat[j] << SGRPROJ_RST_BITS);
        int32_t v = u << SGRPROJ_PRJ_BITS;
        v += xq[1] * (flt1[j] - u);
        const int32_t e =
            ROUND_POWER_OF_TWO(v, SGRPROJ_RST_BITS + SGRPROJ_PRJ_BITS) - src[j];
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
      flt1 += flt1_stride;
    }
  } else {
    for (i = 0; i < height; ++i) {
      for (j = 0; j < width; ++j) {
        const int32_t e = (int32_t)(dat[j]) - src[j];
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
    }
  }

  return err;
}